

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printbuf.c
# Opt level: O3

int printbuf_memset(printbuf *pb,int offset,int charvalue,int len)

{
  int min_size;
  int iVar1;
  int *piVar2;
  
  if (offset == -1) {
    offset = pb->bpos;
  }
  if ((int)(offset ^ 0x7fffffffU) < len || (offset < -1 || len < 0)) {
    piVar2 = __errno_location();
    *piVar2 = 0x1b;
LAB_00109a12:
    iVar1 = -1;
  }
  else {
    min_size = offset + len;
    if (pb->size < min_size) {
      iVar1 = printbuf_extend(pb,min_size);
      if (iVar1 < 0) goto LAB_00109a12;
    }
    iVar1 = pb->bpos;
    if (iVar1 < offset) {
      memset(pb->buf + iVar1,0,(long)(offset - iVar1));
    }
    memset(pb->buf + offset,charvalue,(ulong)(uint)len);
    iVar1 = 0;
    if (pb->bpos < min_size) {
      pb->bpos = min_size;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int printbuf_memset(struct printbuf *pb, int offset, int charvalue, int len)
{
	int size_needed;

	if (offset == -1)
		offset = pb->bpos;
	/* Prevent signed integer overflows with large buffers. */
	if (len < 0 || offset < -1 || len > INT_MAX - offset)
	{
		errno = EFBIG;
		return -1;
	}
	size_needed = offset + len;
	if (pb->size < size_needed)
	{
		if (printbuf_extend(pb, size_needed) < 0)
			return -1;
	}

	if (pb->bpos < offset)
		memset(pb->buf + pb->bpos, '\0', offset - pb->bpos);
	memset(pb->buf + offset, charvalue, len);
	if (pb->bpos < size_needed)
		pb->bpos = size_needed;

	return 0;
}